

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyhashlin.c
# Opt level: O0

void hashlin_shrink_step(tommy_hashlin *hashlin)

{
  tommy_count_t tVar1;
  long lVar2;
  tommy_hashlin_node **first;
  tommy_hashlin_node **second;
  long in_FS_OFFSET;
  tommy_hashlin_node **segment;
  tommy_count_t split_target;
  tommy_hashlin *hashlin_local;
  tommy_hashlin_node **split [2];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (((hashlin->state != 2) && (hashlin->count < hashlin->bucket_max >> 3)) &&
     (6 < hashlin->bucket_bit)) {
    if (hashlin->state == 0) {
      hashlin->low_max = hashlin->bucket_max >> 1;
      hashlin->low_mask = hashlin->bucket_mask >> 1;
      hashlin->split = hashlin->low_max;
    }
    hashlin->state = 2;
  }
  if (hashlin->state == 2) {
    tVar1 = hashlin->count;
    do {
      if (hashlin->split + hashlin->low_max <= tVar1 << 3) goto LAB_00119fd9;
      hashlin->split = hashlin->split - 1;
      first = tommy_hashlin_pos(hashlin,hashlin->split);
      second = tommy_hashlin_pos(hashlin,hashlin->split + hashlin->low_max);
      tommy_list_concat(first,second);
    } while (hashlin->split != 0);
    hashlin->bucket_bit = hashlin->bucket_bit - 1;
    hashlin->bucket_max = 1 << ((byte)hashlin->bucket_bit & 0x1f);
    hashlin->bucket_mask = hashlin->bucket_max - 1;
    lrtr_free(hashlin->bucket[hashlin->bucket_bit] + (1L << ((byte)hashlin->bucket_bit & 0x3f)));
    tommy_hashlin_stable(hashlin);
  }
LAB_00119fd9:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

tommy_inline void hashlin_shrink_step(tommy_hashlin* hashlin)
{
	/* shrink if less than 12.5% full */
	if (hashlin->state != TOMMY_HASHLIN_STATE_SHRINK
		&& hashlin->count < hashlin->bucket_max / 8
	) {
		/* avoid to shrink the first bucket */
		if (hashlin->bucket_bit > TOMMY_HASHLIN_BIT) {
			/* if we are stable, setup a new shrink state */
			/* otherwise continue with the already setup grow one */
			/* but in backward direction */
			if (hashlin->state == TOMMY_HASHLIN_STATE_STABLE) {
				/* set the lower size */
				hashlin->low_max = hashlin->bucket_max / 2;
				hashlin->low_mask = hashlin->bucket_mask / 2;

				/* start from the half going backward */
				hashlin->split = hashlin->low_max;
			}

			/* start reallocation */
			hashlin->state = TOMMY_HASHLIN_STATE_SHRINK;
		}
	}

	/* if we are shrinking */
	if (hashlin->state == TOMMY_HASHLIN_STATE_SHRINK) {
		/* compute the split target required to finish the reallocation before the next resize */
		tommy_count_t split_target = 8 * hashlin->count;

		/* reallocate buckets until the split target */
		while (hashlin->split + hashlin->low_max > split_target) {
			tommy_hashlin_node** split[2];

			/* go backward position */
			--hashlin->split;

			/* get the low bucket */
			split[0] = tommy_hashlin_pos(hashlin, hashlin->split);

			/* get the high bucket */
			split[1] = tommy_hashlin_pos(hashlin, hashlin->split + hashlin->low_max);

			/* concat the high bucket into the low one */
			tommy_list_concat(split[0], split[1]);

			/* if we have finished, clean up and change the state */
			if (hashlin->split == 0) {
				tommy_hashlin_node** segment;

				/* shrink the hash size */
				--hashlin->bucket_bit;
				hashlin->bucket_max = 1 << hashlin->bucket_bit;
				hashlin->bucket_mask = hashlin->bucket_max - 1;

				/* free the last segment */
				segment = hashlin->bucket[hashlin->bucket_bit];
				tommy_free(&segment[((tommy_ptrdiff_t)1) << hashlin->bucket_bit]);

				/* go in stable mode */
				tommy_hashlin_stable(hashlin);
				break;
			}
		}
	}
}